

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O1

void agg::arc_to_bezier(double cx,double cy,double rx,double ry,double start_angle,
                       double sweep_angle,double *curve)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double px [4];
  double py [4];
  double local_48 [4];
  double local_28 [4];
  
  dVar4 = sweep_angle * 0.5;
  dVar5 = cos(dVar4);
  local_28[3] = sin(dVar4);
  local_48[1] = ((1.0 - dVar5) * 4.0) / 3.0;
  local_28[2] = local_28[3] - (dVar5 * local_48[1]) / local_28[3];
  local_28[0] = -local_28[3];
  local_28[1] = -local_28[2];
  local_48[1] = local_48[1] + dVar5;
  local_48[0] = dVar5;
  local_48[2] = local_48[1];
  local_48[3] = dVar5;
  dVar5 = sin(dVar4 + start_angle);
  dVar4 = cos(dVar4 + start_angle);
  lVar3 = 0;
  do {
    dVar1 = *(double *)((long)local_48 + lVar3);
    dVar2 = *(double *)((long)local_28 + lVar3);
    *(double *)((long)curve + lVar3 * 2) = (dVar1 * dVar4 - dVar5 * dVar2) * rx + cx;
    *(double *)((long)curve + lVar3 * 2 + 8) = (dVar1 * dVar5 + dVar2 * dVar4) * ry + cy;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  return;
}

Assistant:

void arc_to_bezier(double cx, double cy, double rx, double ry, 
                       double start_angle, double sweep_angle,
                       double* curve)
    {
        double x0 = cos(sweep_angle / 2.0);
        double y0 = sin(sweep_angle / 2.0);
        double tx = (1.0 - x0) * 4.0 / 3.0;
        double ty = y0 - tx * x0 / y0;
        double px[4];
        double py[4];
        px[0] =  x0;
        py[0] = -y0;
        px[1] =  x0 + tx;
        py[1] = -ty;
        px[2] =  x0 + tx;
        py[2] =  ty;
        px[3] =  x0;
        py[3] =  y0;

        double sn = sin(start_angle + sweep_angle / 2.0);
        double cs = cos(start_angle + sweep_angle / 2.0);

        unsigned i;
        for(i = 0; i < 4; i++)
        {
            curve[i * 2]     = cx + rx * (px[i] * cs - py[i] * sn);
            curve[i * 2 + 1] = cy + ry * (px[i] * sn + py[i] * cs);
        }
    }